

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_path_fill(nk_draw_list *list,nk_color color)

{
  long in_RDI;
  nk_vec2 *points;
  nk_anti_aliasing in_stack_00000148;
  uint in_stack_0000014c;
  nk_vec2 *in_stack_00000150;
  nk_draw_list *in_stack_00000158;
  nk_color in_stack_00000164;
  
  if (in_RDI != 0) {
    nk_buffer_memory(*(nk_buffer **)(in_RDI + 0xb0));
    nk_draw_list_fill_poly_convex
              (in_stack_00000158,in_stack_00000150,in_stack_0000014c,in_stack_00000164,
               in_stack_00000148);
    nk_draw_list_path_clear((nk_draw_list *)0x1129ec);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_path_fill(struct nk_draw_list *list, struct nk_color color)
{
struct nk_vec2 *points;
NK_ASSERT(list);
if (!list) return;
points = (struct nk_vec2*)nk_buffer_memory(list->buffer);
nk_draw_list_fill_poly_convex(list, points, list->path_count, color, list->config.shape_AA);
nk_draw_list_path_clear(list);
}